

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::anon_unknown_0::_is_scalar_next__rmap_val(anon_unknown_0 *this,csubstr s)

{
  bool bVar1;
  int iVar2;
  ro_substr pattern;
  ro_substr chars;
  csubstr s_local;
  
  s_local.len = (size_t)s.str;
  pattern.len = 2;
  pattern.str = "- ";
  s_local.str = (char *)this;
  bVar1 = basic_substring<const_char>::begins_with(&s_local,pattern);
  if ((!bVar1) &&
     (chars.len = 2, chars.str = "{[",
     bVar1 = basic_substring<const_char>::begins_with_any(&s_local,chars), !bVar1)) {
    iVar2 = basic_substring<const_char>::compare(&s_local,"-",1);
    return iVar2 != 0;
  }
  return false;
}

Assistant:

bool _is_scalar_next__rmap_val(csubstr s)
{
    return !(s.begins_with("- ") || s.begins_with_any("{[") || s == "-");
}